

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

bool __thiscall
cinatra::coro_http_client::add_str_part(coro_http_client *this,string *name,string *content)

{
  allocator<char> *__a;
  byte extraout_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  size_t size;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  byte bVar1;
  undefined1 in_stack_ffffffffffffff27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  allocator<char> local_79 [65];
  size_type local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>,_bool>
  *local_30;
  size_type local_20;
  
  this_00 = in_RDX;
  local_20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                       (in_RDX);
  __a = (allocator<char> *)(in_RDI + 0xf10);
  __s = local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff60,(char *)__s,__a);
  std::__cxx11::string::string(this_00,in_RSI);
  local_38 = local_20;
  local_30 = std::
             map<std::__cxx11::string,cinatra::multipart_t,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cinatra::multipart_t>>>
             ::emplace<std::__cxx11::string,cinatra::multipart_t>
                       ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>_>
                         *)in_RDX,in_stack_ffffffffffffff28,
                        (multipart_t *)
                        CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  bVar1 = extraout_DL;
  multipart_t::~multipart_t
            ((multipart_t *)CONCAT17(extraout_DL,CONCAT16(extraout_DL,in_stack_ffffffffffffff20)));
  std::allocator<char>::~allocator(local_79);
  return (bool)(bVar1 & 1);
}

Assistant:

bool add_str_part(std::string name, std::string content) {
    size_t size = content.size();
    return form_data_
        .emplace(std::move(name), multipart_t{"", std::move(content), size})
        .second;
  }